

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void __thiscall duckdb::Linenoise::EditHistoryNext(Linenoise *this,HistoryScrollDirection dir)

{
  idx_t iVar1;
  char *__dest;
  bool bVar2;
  idx_t iVar3;
  char *__src;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  
  iVar3 = History::GetLength();
  if (iVar3 < 2) {
    return;
  }
  iVar1 = iVar3 - 1;
  History::Overwrite(iVar1 - this->history_index,this->buf);
  switch(dir) {
  case LINENOISE_HISTORY_NEXT:
    if (this->history_index == 0) {
      return;
    }
    iVar3 = this->history_index - 1;
    break;
  case LINENOISE_HISTORY_PREV:
    uVar6 = this->history_index + 1;
    this->history_index = uVar6;
    if (iVar3 <= uVar6) {
      this->history_index = iVar1;
      return;
    }
    goto switchD_00221622_default;
  case LINENOISE_HISTORY_START:
    iVar3 = iVar1;
    break;
  case LINENOISE_HISTORY_END:
    iVar3 = 0;
    break;
  default:
    goto switchD_00221622_default;
  }
  this->history_index = iVar3;
switchD_00221622_default:
  __dest = this->buf;
  __src = History::GetEntry(iVar1 - this->history_index);
  strncpy(__dest,__src,this->buflen);
  this->buf[this->buflen - 1] = '\0';
  sVar4 = strlen(this->buf);
  this->pos = sVar4;
  this->len = sVar4;
  bVar2 = Terminal::IsMultiline();
  if (dir == LINENOISE_HISTORY_NEXT && bVar2) {
    sVar5 = ColAndRowToPosition(this,1,(int)this->len);
    this->pos = sVar5;
  }
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditHistoryNext(HistoryScrollDirection dir) {
	auto history_len = History::GetLength();
	if (history_len > 1) {
		/* Update the current history entry before to
		 * overwrite it with the next one. */
		History::Overwrite(history_len - 1 - history_index, buf);
		/* Show the new entry */
		switch (dir) {
		case HistoryScrollDirection::LINENOISE_HISTORY_PREV:
			// scroll back
			history_index++;
			if (history_index >= history_len) {
				history_index = history_len - 1;
				return;
			}
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_NEXT:
			// scroll forwards
			if (history_index == 0) {
				return;
			}
			history_index--;
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_END:
			history_index = 0;
			break;
		case HistoryScrollDirection::LINENOISE_HISTORY_START:
			history_index = history_len - 1;
			break;
		}
		strncpy(buf, History::GetEntry(history_len - 1 - history_index), buflen);
		buf[buflen - 1] = '\0';
		len = pos = strlen(buf);
		if (Terminal::IsMultiline() && dir == HistoryScrollDirection::LINENOISE_HISTORY_NEXT) {
			pos = ColAndRowToPosition(1, len);
		}
		RefreshLine();
	}
}